

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_set_channel_max(OPEN_HANDLE open,uint16_t channel_max_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE channel_max_amqp_value;
  OPEN_INSTANCE *open_instance;
  int result;
  uint16_t channel_max_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._0_4_ = 0x595;
  }
  else {
    item_value = amqpvalue_create_ushort(channel_max_value);
    if (item_value == (AMQP_VALUE)0x0) {
      open_instance._0_4_ = 0x59d;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,3,item_value);
      if (iVar1 == 0) {
        open_instance._0_4_ = 0;
      }
      else {
        open_instance._0_4_ = 0x5a3;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)open_instance;
}

Assistant:

int open_set_channel_max(OPEN_HANDLE open, uint16_t channel_max_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE channel_max_amqp_value = amqpvalue_create_ushort(channel_max_value);
        if (channel_max_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 3, channel_max_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(channel_max_amqp_value);
        }
    }

    return result;
}